

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O0

ssize_t __thiscall
LASwriteItemCompressed_BYTE14_v4::write
          (LASwriteItemCompressed_BYTE14_v4 *this,int __fd,void *__buf,size_t __n)

{
  U32 UVar1;
  undefined4 in_register_00000034;
  U32 local_50;
  U32 local_4c;
  uint local_2c;
  I32 diff;
  U32 i;
  U8 *last_item;
  U32 *context_local;
  U8 *item_local;
  LASwriteItemCompressed_BYTE14_v4 *this_local;
  
  _diff = this->contexts[this->current_context].last_item;
  if (this->current_context != *__buf) {
    this->current_context = *__buf;
    if ((this->contexts[this->current_context].unused & 1U) != 0) {
      createAndInitModelsAndCompressors(this,this->current_context,_diff);
    }
    _diff = this->contexts[this->current_context].last_item;
  }
  for (local_2c = 0; local_2c < this->number; local_2c = local_2c + 1) {
    UVar1 = (uint)*(byte *)(CONCAT44(in_register_00000034,__fd) + (ulong)local_2c) -
            (uint)_diff[local_2c];
    if ((int)UVar1 < 0) {
      local_4c = UVar1 + 0x100;
    }
    else {
      local_50 = UVar1;
      if (0xff < (int)UVar1) {
        local_50 = UVar1 - 0x100;
      }
      local_4c = local_50;
    }
    ArithmeticEncoder::encodeSymbol
              (this->enc_Bytes[local_2c],this->contexts[this->current_context].m_bytes[local_2c],
               local_4c);
    if (UVar1 != 0) {
      this->changed_Bytes[local_2c] = true;
      _diff[local_2c] = *(U8 *)(CONCAT44(in_register_00000034,__fd) + (ulong)local_2c);
    }
  }
  return (ulong)CONCAT31((int3)(local_2c >> 8),1);
}

Assistant:

inline BOOL LASwriteItemCompressed_BYTE14_v4::write(const U8* item, U32& context)
{
  // get last

  U8* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 writer
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndCompressors(current_context, last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // compress

  U32 i;
  I32 diff;
  for (i = 0; i < number; i++)
  {
    diff = item[i] - last_item[i];
    enc_Bytes[i]->encodeSymbol(contexts[current_context].m_bytes[i], U8_FOLD(diff));
    if (diff)
    {
      changed_Bytes[i] = TRUE;
      last_item[i] = item[i];
    }
  }
  return TRUE;
}